

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FixedPipelineRenderer.cpp
# Opt level: O1

void __thiscall
irr::video::COpenGL3MaterialBaseCB::OnSetMaterial(COpenGL3MaterialBaseCB *this,SMaterial *material)

{
  uint uVar1;
  
  this->LightEnable = (bool)((byte)material->field_0xb0 >> 3 & 1);
  uVar1 = (material->AmbientColor).color;
  (this->MaterialAmbient).r = (f32)((float)(uVar1 >> 0x10 & 0xff) * 0.003921569);
  (this->MaterialAmbient).g = (f32)((float)(uVar1 >> 8 & 0xff) * 0.003921569);
  (this->MaterialAmbient).b = (f32)((float)(uVar1 & 0xff) * 0.003921569);
  (this->MaterialAmbient).a = (f32)((float)(uVar1 >> 0x18) * 0.003921569);
  uVar1 = (material->DiffuseColor).color;
  (this->MaterialDiffuse).r = (f32)((float)(uVar1 >> 0x10 & 0xff) * 0.003921569);
  (this->MaterialDiffuse).g = (f32)((float)(uVar1 >> 8 & 0xff) * 0.003921569);
  (this->MaterialDiffuse).b = (f32)((float)(uVar1 & 0xff) * 0.003921569);
  (this->MaterialDiffuse).a = (f32)((float)(uVar1 >> 0x18) * 0.003921569);
  uVar1 = (material->EmissiveColor).color;
  (this->MaterialEmissive).r = (f32)((float)(uVar1 >> 0x10 & 0xff) * 0.003921569);
  (this->MaterialEmissive).g = (f32)((float)(uVar1 >> 8 & 0xff) * 0.003921569);
  (this->MaterialEmissive).b = (f32)((float)(uVar1 & 0xff) * 0.003921569);
  (this->MaterialEmissive).a = (f32)((float)(uVar1 >> 0x18) * 0.003921569);
  uVar1 = (material->SpecularColor).color;
  (this->MaterialSpecular).r = (f32)((float)(uVar1 >> 0x10 & 0xff) * 0.003921569);
  (this->MaterialSpecular).g = (f32)((float)(uVar1 >> 8 & 0xff) * 0.003921569);
  (this->MaterialSpecular).b = (f32)((float)(uVar1 & 0xff) * 0.003921569);
  (this->MaterialSpecular).a = (f32)((float)(uVar1 >> 0x18) * 0.003921569);
  this->MaterialShininess = material->Shininess;
  this->FogEnable = *(uint *)&material->field_0xb0 >> 8 & 1;
  uVar1 = -(uint)(0.0 < (float)material->Thickness);
  this->Thickness = (f32)(~uVar1 & 0x3f800000 | (uint)material->Thickness & uVar1);
  return;
}

Assistant:

void COpenGL3MaterialBaseCB::OnSetMaterial(const SMaterial &material)
{
	LightEnable = material.Lighting;
	MaterialAmbient = SColorf(material.AmbientColor);
	MaterialDiffuse = SColorf(material.DiffuseColor);
	MaterialEmissive = SColorf(material.EmissiveColor);
	MaterialSpecular = SColorf(material.SpecularColor);
	MaterialShininess = material.Shininess;

	FogEnable = material.FogEnable ? 1 : 0;

	Thickness = (material.Thickness > 0.f) ? material.Thickness : 1.f;
}